

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_22::EscapeAnalyzer::applyOldInteractionToReplacement
          (EscapeAnalyzer *this,Expression *old,Expression *rep)

{
  mapped_type mVar1;
  bool bVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  BasicType local_24;
  Expression *local_20;
  Expression *rep_local;
  Expression *old_local;
  EscapeAnalyzer *this_local;
  
  local_20 = rep;
  rep_local = old;
  old_local = (Expression *)this;
  sVar3 = std::
          unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
          ::count(&this->reachedInteractions,&rep_local);
  if (sVar3 == 0) {
    __assert_fail("reachedInteractions.count(old)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                  ,0x21d,
                  "void wasm::(anonymous namespace)::EscapeAnalyzer::applyOldInteractionToReplacement(Expression *, Expression *)"
                 );
  }
  local_24 = unreachable;
  bVar2 = wasm::Type::operator!=(&local_20->type,&local_24);
  if (bVar2) {
    pmVar4 = std::
             unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
             ::operator[](&this->reachedInteractions,&rep_local);
    mVar1 = *pmVar4;
    pmVar4 = std::
             unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
             ::operator[](&this->reachedInteractions,&local_20);
    *pmVar4 = mVar1;
  }
  return;
}

Assistant:

void applyOldInteractionToReplacement(Expression* old, Expression* rep) {
    // We can only replace something relevant that we found in the analysis.
    // (Not only would anything else be invalid to process, but also we wouldn't
    // know what interaction to give the replacement.)
    assert(reachedInteractions.count(old));

    // The replacement should have the same interaction as the thing it
    // replaces, since it is a drop-in replacement for it. The one exception is
    // when we replace with something unreachable, which is the result of us
    // figuring out that some code will trap at runtime. In that case, we've
    // made the code unreachable and the allocation does not interact with that
    // code at all.
    if (rep->type != Type::unreachable) {
      reachedInteractions[rep] = reachedInteractions[old];
    }
  }